

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_scanner.cpp
# Opt level: O1

void __thiscall duckdb::CSVFileScan::SetStart(CSVFileScan *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  idx_t iVar1;
  CSVStateMachine *pCVar2;
  CSVIterator *pCVar3;
  long lVar4;
  CSVIterator *pCVar5;
  CSVIterator *pCVar6;
  ulong rows_to_skip;
  ulong uVar7;
  byte bVar8;
  SkipScanner skip_scanner;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_160;
  shared_ptr<duckdb::CSVBufferManager,_true> local_150;
  SkipScanner local_140;
  
  bVar8 = 0;
  iVar1 = CSVReaderOptions::GetSkipRows(&this->options);
  this_00 = &this->state_machine;
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  uVar7 = (pCVar2->dialect_options).header.value + iVar1;
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  iVar1 = (pCVar2->dialect_options).rows_until_header;
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  rows_to_skip = (pCVar2->dialect_options).header.value + iVar1;
  if (rows_to_skip < uVar7) {
    rows_to_skip = uVar7;
  }
  if (rows_to_skip == 0) {
    (this->start_iterator).first_one = true;
  }
  else {
    local_150.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->buffer_manager).internal.
             super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_150.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->buffer_manager).internal.
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_150.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_150.internal.
              super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_150.internal.
              super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_160.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->error_handler).internal.
             super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_160.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->error_handler).internal.
         super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_160.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_160.internal.
              super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_160.internal.
              super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    SkipScanner::SkipScanner(&local_140,&local_150,this_00,&local_160,rows_to_skip);
    if (local_160.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.internal.
                 super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if (local_150.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.internal.
                 super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    SkipScanner::ParseChunk(&local_140);
    pCVar3 = BaseScanner::GetIterator(&local_140.super_BaseScanner);
    pCVar5 = pCVar3;
    pCVar6 = &this->start_iterator;
    for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pCVar6->pos).buffer_idx = (pCVar5->pos).buffer_idx;
      pCVar5 = (CSVIterator *)((long)pCVar5 + (ulong)bVar8 * -0x10 + 8);
      pCVar6 = (CSVIterator *)((long)pCVar6 + (ulong)bVar8 * -0x10 + 8);
    }
    (this->start_iterator).is_set = pCVar3->is_set;
    BaseScanner::~BaseScanner(&local_140.super_BaseScanner);
  }
  return;
}

Assistant:

void CSVFileScan::SetStart() {
	idx_t rows_to_skip = options.GetSkipRows() + state_machine->dialect_options.header.GetValue();
	rows_to_skip = std::max(rows_to_skip, state_machine->dialect_options.rows_until_header +
	                                          state_machine->dialect_options.header.GetValue());
	if (rows_to_skip == 0) {
		start_iterator.first_one = true;
		return;
	}
	SkipScanner skip_scanner(buffer_manager, state_machine, error_handler, rows_to_skip);
	skip_scanner.ParseChunk();
	start_iterator = skip_scanner.GetIterator();
}